

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

aom_codec_err_t
av1_set_reference_dec(AV1_COMMON *cm,int idx,int use_external_ref,YV12_BUFFER_CONFIG *sd)

{
  int iVar1;
  YV12_BUFFER_CONFIG *a;
  YV12_BUFFER_CONFIG *in_RCX;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  int unaff_retaddr;
  YV12_BUFFER_CONFIG *ref_buf;
  YV12_BUFFER_CONFIG *in_stack_00000010;
  int num_planes;
  aom_codec_err_t local_4;
  
  av1_num_planes(in_RDI);
  a = get_ref_frame(in_RDI,in_ESI);
  if (a == (YV12_BUFFER_CONFIG *)0x0) {
    aom_internal_error(in_RDI->error,AOM_CODEC_ERROR,"No reference frame");
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    if (in_EDX == 0) {
      iVar1 = equal_dimensions(a,in_RCX);
      if (iVar1 == 0) {
        aom_internal_error(in_RDI->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
      }
      else {
        aom_yv12_copy_frame_c(in_stack_00000010,ref_buf,unaff_retaddr);
      }
    }
    else {
      iVar1 = equal_dimensions_and_border(a,in_RCX);
      if (iVar1 == 0) {
        aom_internal_error(in_RDI->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
      }
      else {
        a->store_buf_adr[0] = (a->field_5).field_0.y_buffer;
        a->store_buf_adr[1] = (a->field_5).field_0.u_buffer;
        a->store_buf_adr[2] = (a->field_5).field_0.v_buffer;
        (a->field_5).field_0.y_buffer = (in_RCX->field_5).field_0.y_buffer;
        (a->field_5).field_0.u_buffer = (in_RCX->field_5).field_0.u_buffer;
        (a->field_5).field_0.v_buffer = (in_RCX->field_5).field_0.v_buffer;
        a->use_external_reference_buffers = 1;
      }
    }
    local_4 = in_RDI->error->error_code;
  }
  return local_4;
}

Assistant:

aom_codec_err_t av1_set_reference_dec(AV1_COMMON *cm, int idx,
                                      int use_external_ref,
                                      YV12_BUFFER_CONFIG *sd) {
  const int num_planes = av1_num_planes(cm);
  YV12_BUFFER_CONFIG *ref_buf = NULL;

  // Get the destination reference buffer.
  ref_buf = get_ref_frame(cm, idx);

  if (ref_buf == NULL) {
    aom_internal_error(cm->error, AOM_CODEC_ERROR, "No reference frame");
    return AOM_CODEC_ERROR;
  }

  if (!use_external_ref) {
    if (!equal_dimensions(ref_buf, sd)) {
      aom_internal_error(cm->error, AOM_CODEC_ERROR,
                         "Incorrect buffer dimensions");
    } else {
      // Overwrite the reference frame buffer.
      aom_yv12_copy_frame(sd, ref_buf, num_planes);
    }
  } else {
    if (!equal_dimensions_and_border(ref_buf, sd)) {
      aom_internal_error(cm->error, AOM_CODEC_ERROR,
                         "Incorrect buffer dimensions");
    } else {
      // Overwrite the reference frame buffer pointers.
      // Once we no longer need the external reference buffer, these pointers
      // are restored.
      ref_buf->store_buf_adr[0] = ref_buf->y_buffer;
      ref_buf->store_buf_adr[1] = ref_buf->u_buffer;
      ref_buf->store_buf_adr[2] = ref_buf->v_buffer;
      ref_buf->y_buffer = sd->y_buffer;
      ref_buf->u_buffer = sd->u_buffer;
      ref_buf->v_buffer = sd->v_buffer;
      ref_buf->use_external_reference_buffers = 1;
    }
  }

  return cm->error->error_code;
}